

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testRunStarting(XmlReporter *this,TestRunInfo *testInfo)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *in_RDI;
  string stylesheetRef;
  string *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  XmlFormatting in_stack_fffffffffffffe14;
  string *in_stack_fffffffffffffe18;
  string *name;
  XmlWriter *in_stack_fffffffffffffe20;
  ScopedElement *this_01;
  XmlFormatting fmt;
  undefined4 in_stack_fffffffffffffe30;
  XmlWriter *in_stack_fffffffffffffe38;
  allocator<char> *in_stack_fffffffffffffe40;
  allocator<char> *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  XmlWriter *this_02;
  undefined1 local_171 [40];
  allocator<char> local_149;
  string local_148 [48];
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [32];
  string local_d0 [39];
  undefined1 local_a9 [33];
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [48];
  string local_30 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  StreamingReporterBase<Catch::XmlReporter>::testRunStarting
            ((StreamingReporterBase<Catch::XmlReporter> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             (TestRunInfo *)in_stack_fffffffffffffe08);
  (**(code **)(*in_RDI + 0xb0))(local_30);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    XmlWriter::writeStylesheetRef
              ((XmlWriter *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe08);
  }
  this_02 = (XmlWriter *)(in_RDI + 0x2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  operator|(Newline,Indent);
  XmlWriter::startElement
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  peVar5 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x146f58);
  (*(peVar5->super_NonCopyable)._vptr_NonCopyable[4])(local_88);
  bVar1 = std::__cxx11::string::empty();
  bVar1 = bVar1 ^ 0xff;
  std::__cxx11::string::~string(local_88);
  if ((bVar1 & 1) != 0) {
    in_stack_fffffffffffffe60 = (string *)local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40
              );
    peVar5 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x146fe6);
    (*(peVar5->super_NonCopyable)._vptr_NonCopyable[4])(local_d0);
    XmlWriter::writeAttribute
              (this_02,(string *)CONCAT17(bVar1,in_stack_fffffffffffffe68),in_stack_fffffffffffffe60
              );
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string((string *)(local_a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_a9);
  }
  peVar5 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x147107);
  iVar3 = (*(peVar5->super_NonCopyable)._vptr_NonCopyable[0xd])();
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(extraout_var,iVar3);
  bVar2 = TestSpec::hasFilters((TestSpec *)0x147124);
  if (bVar2) {
    in_stack_fffffffffffffe40 = (allocator<char> *)(in_RDI + 0x2e);
    in_stack_fffffffffffffe48 = &local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    peVar5 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x147178);
    iVar3 = (*(peVar5->super_NonCopyable)._vptr_NonCopyable[0xf])();
    in_stack_fffffffffffffe38 = (XmlWriter *)CONCAT44(extraout_var_00,iVar3);
    serializeFilters((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(bVar1,in_stack_fffffffffffffe68));
    XmlWriter::writeAttribute
              (this_02,(string *)CONCAT17(bVar1,in_stack_fffffffffffffe68),in_stack_fffffffffffffe60
              );
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
  }
  peVar5 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x14725e);
  iVar3 = (*(peVar5->super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar3 != 0) {
    this_01 = (ScopedElement *)(in_RDI + 0x2e);
    fmt = (XmlFormatting)((ulong)&local_149 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              (in_stack_fffffffffffffe38,(string *)CONCAT44(iVar3,in_stack_fffffffffffffe30),fmt);
    name = (string *)local_171;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    peVar5 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x147325);
    iVar3 = (*(peVar5->super_NonCopyable)._vptr_NonCopyable[0x11])();
    XmlWriter::ScopedElement::writeAttribute<unsigned_int>
              (this_01,name,(uint *)CONCAT44(iVar3,in_stack_fffffffffffffe10));
    std::__cxx11::string::~string((string *)(local_171 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_171);
    XmlWriter::ScopedElement::~ScopedElement
              ((ScopedElement *)CONCAT44(iVar3,in_stack_fffffffffffffe10));
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator(&local_149);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void XmlReporter::testRunStarting( TestRunInfo const& testInfo ) {
        StreamingReporterBase::testRunStarting( testInfo );
        std::string stylesheetRef = getStylesheetRef();
        if( !stylesheetRef.empty() )
            m_xml.writeStylesheetRef( stylesheetRef );
        m_xml.startElement( "Catch" );
        if( !m_config->name().empty() )
            m_xml.writeAttribute( "name", m_config->name() );
        if (m_config->testSpec().hasFilters())
            m_xml.writeAttribute( "filters", serializeFilters( m_config->getTestsOrTags() ) );
        if( m_config->rngSeed() != 0 )
            m_xml.scopedElement( "Randomness" )
                .writeAttribute( "seed", m_config->rngSeed() );
    }